

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O0

exr_result_t
exr_attr_list_remove(exr_context_t ctxt,exr_attribute_list_t *list,exr_attribute_t *attr)

{
  int iVar1;
  long lVar2;
  exr_context_t ctxt_00;
  int iVar3;
  long in_RDX;
  int *in_RSI;
  long in_RDI;
  int i_2;
  int i_1;
  int i;
  exr_attribute_t **attrs;
  int attridx;
  int cattrsz;
  int local_3c;
  int iVar4;
  int local_28;
  exr_result_t local_4;
  
  local_28 = -1;
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else if (in_RDX == 0) {
    local_4 = (**(code **)(in_RDI + 0x40))(in_RDI,3,"NULL attribute passed to remove");
  }
  else if (in_RSI == (int *)0x0) {
    local_4 = (**(code **)(in_RDI + 0x40))(in_RDI,3,"Invalid list pointer to remove attribute");
  }
  else {
    iVar1 = *in_RSI;
    lVar2 = *(long *)(in_RSI + 2);
    iVar4 = 0;
    while ((iVar3 = local_28, iVar4 < iVar1 &&
           (iVar3 = iVar4, *(long *)(lVar2 + (long)iVar4 * 8) != in_RDX))) {
      iVar4 = iVar4 + 1;
    }
    local_28 = iVar3;
    if (local_28 == -1) {
      local_4 = (**(code **)(in_RDI + 0x40))(in_RDI,3,"Attribute not in list");
    }
    else {
      *(undefined8 *)(*(long *)(in_RSI + 2) + (long)local_28 * 8) = 0;
      for (iVar3 = local_28; iVar3 < iVar1 + -1; iVar3 = iVar3 + 1) {
        *(undefined8 *)(lVar2 + (long)iVar3 * 8) = *(undefined8 *)(lVar2 + (long)(iVar3 + 1) * 8);
      }
      *in_RSI = iVar1 + -1;
      ctxt_00 = *(exr_context_t *)(in_RSI + 4);
      local_28 = 0;
      for (local_3c = 0; local_3c < iVar1; local_3c = local_3c + 1) {
        if (*(long *)(&ctxt_00->mode + (long)local_3c * 8) != in_RDX) {
          *(undefined8 *)(&ctxt_00->mode + (long)local_28 * 8) =
               *(undefined8 *)(&ctxt_00->mode + (long)local_3c * 8);
          local_28 = local_28 + 1;
        }
      }
      local_4 = attr_destroy(ctxt_00,(exr_attribute_t *)CONCAT44(iVar4,iVar3));
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_list_remove (
    exr_context_t ctxt, exr_attribute_list_t* list, exr_attribute_t* attr)
{
    int               cattrsz, attridx = -1;
    exr_attribute_t** attrs;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!attr)
    {
        return ctxt->report_error (
            ctxt, EXR_ERR_INVALID_ARGUMENT, "NULL attribute passed to remove");
    }

    if (!list)
    {
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid list pointer to remove attribute");
    }

    cattrsz = list->num_attributes;
    attrs   = list->entries;
    for (int i = 0; i < cattrsz; ++i)
    {
        if (attrs[i] == attr)
        {
            attridx = i;
            break;
        }
    }

    if (attridx == -1)
    {
        return ctxt->report_error (
            ctxt, EXR_ERR_INVALID_ARGUMENT, "Attribute not in list");
    }

    list->entries[attridx] = NULL;
    for (int i = attridx; i < (cattrsz - 1); ++i)
        attrs[i] = attrs[i + 1];
    list->num_attributes = cattrsz - 1;

    attrs   = list->sorted_entries;
    attridx = 0;
    for (int i = 0; i < cattrsz; ++i)
    {
        if (attrs[i] == attr) continue;
        attrs[attridx++] = attrs[i];
    }

    return attr_destroy (ctxt, attr);
}